

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_vectors.h
# Opt level: O0

void __thiscall Bitvec16x16::Insert(Bitvec16x16 *this,int index,uint16_t value)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  uint16_t value_local;
  int index_local;
  Bitvec16x16 *this_local;
  
  switch(index) {
  case 0:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,0);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 1:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,1);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 2:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,2);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 3:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,3);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 4:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,4);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 5:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,5);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 6:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,6);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 7:
    auVar1 = vpinsrw_avx(SUB3216(*(undefined1 (*) [32])this->vec,0),(uint)value,7);
    auVar9 = vblendps_avx(*(undefined1 (*) [32])this->vec,ZEXT1632(auVar1),0xf);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 8:
    auVar2._2_2_ = value;
    auVar2._0_2_ = value;
    auVar2._4_2_ = value;
    auVar2._6_2_ = value;
    auVar2._8_2_ = value;
    auVar2._10_2_ = value;
    auVar2._12_2_ = value;
    auVar2._14_2_ = value;
    auVar2._16_2_ = value;
    auVar2._18_2_ = value;
    auVar2._20_2_ = value;
    auVar2._22_2_ = value;
    auVar2._24_2_ = value;
    auVar2._26_2_ = value;
    auVar2._28_2_ = value;
    auVar2._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar2,1);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 9:
    auVar3._2_2_ = value;
    auVar3._0_2_ = value;
    auVar3._4_2_ = value;
    auVar3._6_2_ = value;
    auVar3._8_2_ = value;
    auVar3._10_2_ = value;
    auVar3._12_2_ = value;
    auVar3._14_2_ = value;
    auVar3._16_2_ = value;
    auVar3._18_2_ = value;
    auVar3._20_2_ = value;
    auVar3._22_2_ = value;
    auVar3._24_2_ = value;
    auVar3._26_2_ = value;
    auVar3._28_2_ = value;
    auVar3._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar3,2);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 10:
    auVar4._2_2_ = value;
    auVar4._0_2_ = value;
    auVar4._4_2_ = value;
    auVar4._6_2_ = value;
    auVar4._8_2_ = value;
    auVar4._10_2_ = value;
    auVar4._12_2_ = value;
    auVar4._14_2_ = value;
    auVar4._16_2_ = value;
    auVar4._18_2_ = value;
    auVar4._20_2_ = value;
    auVar4._22_2_ = value;
    auVar4._24_2_ = value;
    auVar4._26_2_ = value;
    auVar4._28_2_ = value;
    auVar4._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar4,4);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 0xb:
    auVar5._2_2_ = value;
    auVar5._0_2_ = value;
    auVar5._4_2_ = value;
    auVar5._6_2_ = value;
    auVar5._8_2_ = value;
    auVar5._10_2_ = value;
    auVar5._12_2_ = value;
    auVar5._14_2_ = value;
    auVar5._16_2_ = value;
    auVar5._18_2_ = value;
    auVar5._20_2_ = value;
    auVar5._22_2_ = value;
    auVar5._24_2_ = value;
    auVar5._26_2_ = value;
    auVar5._28_2_ = value;
    auVar5._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar5,8);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 0xc:
    auVar6._2_2_ = value;
    auVar6._0_2_ = value;
    auVar6._4_2_ = value;
    auVar6._6_2_ = value;
    auVar6._8_2_ = value;
    auVar6._10_2_ = value;
    auVar6._12_2_ = value;
    auVar6._14_2_ = value;
    auVar6._16_2_ = value;
    auVar6._18_2_ = value;
    auVar6._20_2_ = value;
    auVar6._22_2_ = value;
    auVar6._24_2_ = value;
    auVar6._26_2_ = value;
    auVar6._28_2_ = value;
    auVar6._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar6,0x10);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 0xd:
    auVar7._2_2_ = value;
    auVar7._0_2_ = value;
    auVar7._4_2_ = value;
    auVar7._6_2_ = value;
    auVar7._8_2_ = value;
    auVar7._10_2_ = value;
    auVar7._12_2_ = value;
    auVar7._14_2_ = value;
    auVar7._16_2_ = value;
    auVar7._18_2_ = value;
    auVar7._20_2_ = value;
    auVar7._22_2_ = value;
    auVar7._24_2_ = value;
    auVar7._26_2_ = value;
    auVar7._28_2_ = value;
    auVar7._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar7,0x20);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 0xe:
    auVar8._2_2_ = value;
    auVar8._0_2_ = value;
    auVar8._4_2_ = value;
    auVar8._6_2_ = value;
    auVar8._8_2_ = value;
    auVar8._10_2_ = value;
    auVar8._12_2_ = value;
    auVar8._14_2_ = value;
    auVar8._16_2_ = value;
    auVar8._18_2_ = value;
    auVar8._20_2_ = value;
    auVar8._22_2_ = value;
    auVar8._24_2_ = value;
    auVar8._26_2_ = value;
    auVar8._28_2_ = value;
    auVar8._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar8,0x40);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
    break;
  case 0xf:
    auVar9._2_2_ = value;
    auVar9._0_2_ = value;
    auVar9._4_2_ = value;
    auVar9._6_2_ = value;
    auVar9._8_2_ = value;
    auVar9._10_2_ = value;
    auVar9._12_2_ = value;
    auVar9._14_2_ = value;
    auVar9._16_2_ = value;
    auVar9._18_2_ = value;
    auVar9._20_2_ = value;
    auVar9._22_2_ = value;
    auVar9._24_2_ = value;
    auVar9._26_2_ = value;
    auVar9._28_2_ = value;
    auVar9._30_2_ = value;
    auVar9 = vpblendw_avx2(*(undefined1 (*) [32])this->vec,auVar9,0x80);
    auVar9 = vpblendd_avx2(*(undefined1 (*) [32])this->vec,auVar9,0xf0);
    *(undefined1 (*) [32])this->vec = auVar9;
  }
  return;
}

Assistant:

inline void Insert(int index, uint16_t value) {
#define CASE(x) case x: vec = _mm256_insert_epi16(vec, value, x); break;
        switch (index) {
            CASE(0)
            CASE(1)
            CASE(2)
            CASE(3)
            CASE(4)
            CASE(5)
            CASE(6)
            CASE(7)
            CASE(8)
            CASE(9)
            CASE(10)
            CASE(11)
            CASE(12)
            CASE(13)
            CASE(14)
            CASE(15)
        }
#undef CASE
    }